

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O1

void __thiscall Js::BigUInt::Subtract(BigUInt *this,BigUInt *pbi)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  
  AssertValid(this,true);
  if (pbi == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x18d,"(pbi)","pbi");
    if (!bVar3) goto LAB_00698063;
    *puVar6 = 0;
  }
  AssertValid(pbi,true);
  if (this == pbi) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x18e,"(this != pbi)","this != pbi");
    if (!bVar3) goto LAB_00698063;
    *puVar6 = 0;
  }
  if (this->m_clu < pbi->m_clu) {
LAB_00697fcf:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1b0,"(false)","Who\'s subtracting to negative?");
    if (!bVar3) {
LAB_00698063:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
LAB_00698020:
    iVar5 = 0;
  }
  else {
    if (pbi->m_clu < 1) {
      bVar3 = false;
      uVar9 = 0;
    }
    else {
      uVar4 = 1;
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar8 = 0;
      lVar10 = 0;
      do {
        if (pbi->m_cluMax <= lVar10) break;
        if (1 < uVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                      ,0x19a,"(wCarry == 0 || wCarry == 1)",
                                      "wCarry == 0 || wCarry == 1");
          if (!bVar3) goto LAB_00698063;
          *puVar6 = 0;
        }
        if ((pbi->m_prglu[lVar10] != 0) || (uVar4 == 0)) {
          uVar4 = NumberUtilities::AddLu
                            ((uint32 *)((long)this->m_prglu + lVar8),uVar4 + ~pbi->m_prglu[lVar10]);
        }
        lVar10 = lVar10 + 1;
        lVar8 = lVar8 + 4;
      } while (lVar10 < pbi->m_clu);
      uVar9 = (uint)lVar10;
      bVar3 = uVar4 == 0;
    }
    uVar4 = this->m_clu;
    if (((bVar3) && ((int)uVar9 < (int)uVar4)) && ((int)uVar9 < this->m_cluMax)) {
      do {
        iVar5 = NumberUtilities::AddLu(this->m_prglu + (int)uVar9,0xffffffff);
        uVar4 = this->m_clu;
        bVar3 = iVar5 == 0;
        if ((!bVar3) || ((int)uVar4 <= (int)uVar9)) break;
      } while ((int)uVar9 < this->m_cluMax);
    }
    if (bVar3) goto LAB_00697fcf;
    if (uVar9 != uVar4) goto LAB_00698025;
    uVar7 = (ulong)uVar9;
    do {
      if ((long)uVar7 < 1) goto LAB_00698020;
      uVar1 = uVar7 - 1;
      lVar8 = uVar7 - 1;
      uVar7 = uVar1;
    } while (this->m_prglu[lVar8] == 0);
    iVar5 = (int)uVar1 + 1;
  }
  this->m_clu = iVar5;
LAB_00698025:
  AssertValid(this,true);
  return;
}

Assistant:

void BigUInt::Subtract(BigUInt *pbi)
    {
        AssertBi(this);
        AssertBi(pbi);
        Assert(this != pbi);

        int32 ilu;
        int wCarry;
        uint32 luT;

        if (m_clu < pbi->m_clu)
            goto LNegative;

        wCarry = 1;
        for (ilu = 0; (ilu < pbi->m_clu) && (ilu < pbi->m_cluMax); ilu++)
        {
            Assert(wCarry == 0 || wCarry == 1);
            luT = pbi->m_prglu[ilu];

            // NOTE: We should really do:
            //    wCarry = AddLu(&m_prglu[ilu], wCarry);
            //    wCarry += AddLu(&m_prglu[ilu], ~luT);
            // The only case where this is different than
            //    wCarry = AddLu(&m_prglu[ilu], ~luT + wCarry);
            // is when luT == 0 and 1 == wCarry, in which case we don't
            // need to add anything and wCarry should still be 1, so we can
            // just skip the operations.

            if (0 != luT || 0 == wCarry)
                wCarry = NumberUtilities::AddLu(&m_prglu[ilu], ~luT + wCarry);
        }
        while ((0 == wCarry) && (ilu < m_clu) && (ilu < m_cluMax))
            wCarry = NumberUtilities::AddLu(&m_prglu[ilu], 0xFFFFFFFF);

        if (0 == wCarry)
        {
LNegative:
            // pbi was bigger than this.
            AssertMsg(false, "Who's subtracting to negative?");
            m_clu = 0;
        }
        else if (ilu == m_clu)
        {
            // Trim off zeros.
            while (--ilu >= 0 && 0 == m_prglu[ilu])
                ;
            m_clu = ilu + 1;
        }

        AssertBi(this);
    }